

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::SortHelper<StringItem>(Var array,CompareVarsInfo *cvInfo)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  Var pvVar2;
  uint32 uVar3;
  bool bVar4;
  BOOL BVar5;
  Type TVar6;
  undefined4 *puVar7;
  undefined4 extraout_var;
  TempArenaAllocatorObject *tempAllocator;
  StringItem *list;
  RecyclableObject *this;
  JavascriptArray *pJVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  size_t requestedBytes;
  uint32 index;
  ulong uVar12;
  Var local_80;
  Var item;
  int local_70;
  uint32 local_6c;
  undefined1 local_68 [8];
  JsReentLock jsReentLock;
  RecyclableObject *local_38;
  RecyclableObject *obj;
  
  scriptContext = cvInfo->scriptContext;
  local_68 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_68)->noJsReentrancy;
  ((ThreadContext *)local_68)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_68,array);
  local_38 = (RecyclableObject *)0x0;
  BVar5 = JavascriptConversion::ToObject(array,scriptContext,&local_38);
  if (BVar5 == 0) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec42,L"Array.prototype.sort");
  }
  *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  jsReentLock._24_8_ = JavascriptOperators::OP_GetLength(local_38,scriptContext);
  uVar10 = jsReentLock._24_8_ & 0xffff000000000000;
  uVar12 = jsReentLock._24_8_ & 0x1ffff00000000;
  if (uVar12 != 0x1000000000000 && uVar10 == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_00ba0b9b;
    *puVar7 = 0;
  }
  if (uVar10 == 0x1000000000000) {
    if (uVar12 != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar4) goto LAB_00ba0b9b;
      *puVar7 = 0;
    }
  }
  else {
    jsReentLock._24_4_ = JavascriptConversion::ToUInt32_Full((Var)jsReentLock._24_8_,scriptContext);
    jsReentLock._28_4_ = extraout_var;
  }
  JsReentLock::MutateArrayObject((JsReentLock *)local_68);
  *(bool *)((long)local_68 + 0x108) = true;
  if (jsReentLock._24_4_ == 0) goto LAB_00ba0b7b;
  item = scriptContext;
  tempAllocator = ScriptContext::GetTemporaryAllocator(scriptContext,L"Runtime");
  BVar5 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar5 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar4) goto LAB_00ba0b9b;
    *puVar7 = 0;
  }
  requestedBytes = (jsReentLock._24_8_ & 0xffffffff) << 4;
  list = (StringItem *)
         Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::AllocInternal
                   (&(tempAllocator->allocator).
                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
                    requestedBytes);
  if (list == (StringItem *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar4) {
LAB_00ba0b9b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar7 = 0;
  }
  index = 0;
  memset(list,0,requestedBytes);
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  jsReentLock._24_8_ = ZEXT48(jsReentLock._24_4_ + (uint)(jsReentLock._24_4_ == 0));
  iVar9 = 0;
  local_70 = 0;
  local_6c = 0;
LAB_00ba0769:
  *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  BVar5 = JavascriptOperators::HasItem(local_38,index);
  JsReentLock::MutateArrayObject((JsReentLock *)local_68);
  *(bool *)((long)local_68 + 0x108) = true;
  if (BVar5 == 0) {
LAB_00ba09bd:
    iVar9 = iVar9 + 1;
    goto LAB_00ba09bf;
  }
  local_80 = (Var)0x0;
  *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  BVar5 = JavascriptOperators::GetItem(local_38,index,&local_80,(ScriptContext *)item);
  JsReentLock::MutateArrayObject((JsReentLock *)local_68);
  pvVar2 = local_80;
  *(bool *)((long)local_68 + 0x108) = true;
  if (BVar5 == 0) goto LAB_00ba09bd;
  if (local_80 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00ba0b9b;
    *puVar7 = 0;
  }
  if (((ulong)pvVar2 & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)pvVar2 & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_00ba0b9b;
    *puVar7 = 0;
  }
  if ((ulong)pvVar2 >> 0x32 == 0 && ((ulong)pvVar2 & 0xffff000000000000) != 0x1000000000000) {
    this = UnsafeVarTo<Js::RecyclableObject>(pvVar2);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00ba0b9b;
      *puVar7 = 0;
    }
    TVar6 = ((this->type).ptr)->typeId;
    if (0x57 < (int)TVar6) {
      BVar5 = RecyclableObject::IsExternal(this);
      if (BVar5 != 0) goto LAB_00ba0998;
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar4) goto LAB_00ba0b9b;
      *puVar7 = 0;
      goto LAB_00ba0998;
    }
  }
  else {
LAB_00ba0998:
    TVar6 = TypeIds_FirstNumberType;
  }
  if (TVar6 == TypeIds_Undefined) {
    local_70 = local_70 + 1;
  }
  else {
    SortSetHelper(list,local_80,local_6c,(JsReentLock *)local_68,(ScriptContext *)item);
    local_6c = local_6c + 1;
  }
LAB_00ba09bf:
  uVar3 = local_6c;
  index = index + 1;
  if (jsReentLock._24_4_ == index) goto LAB_00ba09d3;
  goto LAB_00ba0769;
LAB_00ba09d3:
  *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  if (local_6c < 0x200) {
    InsertionSort<StringItem>(list,local_6c,cvInfo);
    JsReentLock::MutateArrayObject((JsReentLock *)local_68);
  }
  else {
    MergeSort<StringItem>(list,local_6c,cvInfo,&tempAllocator->allocator);
    JsReentLock::MutateArrayObject((JsReentLock *)local_68);
  }
  *(bool *)((long)local_68 + 0x108) = true;
  if (uVar3 == 0) {
    uVar10 = 0;
  }
  else {
    uVar10 = 0;
    do {
      *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      JavascriptOperators::SetItem
                (local_38,local_38,(uint32)uVar10,(list->Value).ptr,(ScriptContext *)item,
                 PropertyOperation_ThrowIfNonWritable|PropertyOperation_ThrowIfNotExtensible,0);
      JsReentLock::MutateArrayObject((JsReentLock *)local_68);
      *(bool *)((long)local_68 + 0x108) = true;
      uVar10 = uVar10 + 1;
      list = list + 1;
    } while (uVar3 != uVar10);
  }
  pvVar2 = item;
  if (local_70 != 0) {
    iVar11 = local_70;
    do {
      *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      JavascriptOperators::SetItem
                (local_38,local_38,(uint32)uVar10,*(Var *)(*(long *)((long)pvVar2 + 8) + 0x430),
                 (ScriptContext *)pvVar2,
                 PropertyOperation_ThrowIfNonWritable|PropertyOperation_ThrowIfNotExtensible,0);
      JsReentLock::MutateArrayObject((JsReentLock *)local_68);
      *(bool *)((long)local_68 + 0x108) = true;
      uVar10 = (ulong)((uint32)uVar10 + 1);
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
  }
  if (iVar9 != 0) {
    do {
      *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      JavascriptOperators::DeleteItem
                (local_38,(uint32)uVar10,PropertyOperation_ThrowOnDeleteIfNotConfig);
      JsReentLock::MutateArrayObject((JsReentLock *)local_68);
      *(bool *)((long)local_68 + 0x108) = true;
      uVar10 = (ulong)((uint32)uVar10 + 1);
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
  }
  ScriptContext::ReleaseTemporaryAllocator((ScriptContext *)pvVar2,tempAllocator);
  bVar4 = DynamicObject::IsAnyArray(local_38);
  if (bVar4) {
    pJVar8 = UnsafeVarTo<Js::JavascriptArray,Js::RecyclableObject>(local_38);
    ClearSegmentMap(pJVar8);
    pJVar8 = UnsafeVarTo<Js::JavascriptArray,Js::RecyclableObject>(local_38);
    (*(pJVar8->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
      .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])(pJVar8);
  }
LAB_00ba0b7b:
  *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return local_38;
}

Assistant:

Var JavascriptArray::SortHelper(Var array, JavascriptArray::CompareVarsInfo* cvInfo)
    {
        ScriptContext* scriptContext = cvInfo->scriptContext;
        
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, array);

        // Per spec, throw if the 'this' value is not a valid object
        RecyclableObject* obj = nullptr;
        if (FALSE == JavascriptConversion::ToObject(array, scriptContext, &obj))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Array.prototype.sort"));
        }

        // Get the Length
        JS_REENTRANT(jsReentLock,
            uint32 len = JavascriptConversion::ToUInt32(JavascriptOperators::OP_GetLength(obj, scriptContext), scriptContext));

        // Early return if length = 0
        // Note cannot return early for length = 1 without further checks
        // As per spec we must use HasItem() and GetItem() on each element
        if (len == 0)
        {
            return obj;
        }

        BEGIN_TEMP_ALLOCATOR(tempAlloc, scriptContext, _u("Runtime"))
        {
            // Spec mandates that we copy the array into a 'list' before sorting
            // This severely limits the potential for sort side-effects to alter the result
            T* list = AnewArray(tempAlloc, T, len);

            uint32 values = 0;
            uint32 undefinedValues = 0;
            uint32 holes = 0;
            uint32 i = 0, j = 0;

            for (; i < len; ++i)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, i));
                
                if (hasItem)
                {
                    Var item = nullptr;
                    JS_REENTRANT(jsReentLock, BOOL gotItem = JavascriptOperators::GetItem(obj, i, &item, scriptContext));
                    if (gotItem)
                    {
                        TypeId type = JavascriptOperators::GetTypeId(item);
                        if (type != TypeIds_Undefined)
                        {
                            // If T = Var this adds item to the list
                            // If T = StringItem this creates a StringItem from the Var and adds that to the list
                            SortSetHelper(list, item, values, &jsReentLock, scriptContext);
                            values++;
                        }
                        else
                        {
                            ++undefinedValues;
                        }
                    }
                    else
                    {
                        ++holes;
                    }
                }
                else
                {
                    ++holes;
                }
            }

            // Call the appropriate Sorting Algorithm
            // Insertion sort uses less memory and is quicker on short arrays but gets less efficient as arrays get longer
            if (values < 512)
            {
                JS_REENTRANT(jsReentLock, JavascriptArray::InsertionSort<T>(list, values, cvInfo));
            }
            else
            {
                JS_REENTRANT(jsReentLock, JavascriptArray::MergeSort<T>(list, values, cvInfo, tempAlloc));
            }

            // Write the sorted data back to the original array
            // Undefined values and holes are placed at the end
            for (i = 0; i < values; ++i)
            {
                JS_REENTRANT(jsReentLock, JavascriptOperators::SetItem(obj, obj, i, SortGetHelper(list, i), scriptContext, static_cast<PropertyOperationFlags>(PropertyOperation_ThrowIfNonWritable | PropertyOperation_ThrowIfNotExtensible)));
            }
            for (; j < undefinedValues; ++j, ++i)
            {
                JS_REENTRANT(jsReentLock, JavascriptOperators::SetItem(obj, obj, i, scriptContext->GetLibrary()->GetUndefined(), scriptContext, static_cast<PropertyOperationFlags>(PropertyOperation_ThrowIfNonWritable | PropertyOperation_ThrowIfNotExtensible)));
            }
            for (j = 0; j < holes; ++j, ++i)
            {
                JS_REENTRANT(jsReentLock, JavascriptOperators::DeleteItem(obj, i, PropertyOperation_ThrowOnDeleteIfNotConfig));
            }
        }
        END_TEMP_ALLOCATOR(tempAlloc, scriptContext);

        // if the Array is not just an array-like object but an actual array we clear the Segment map
        // optimised access CC generates for arrays that may have been mangled by sorting
        if (VarIs<JavascriptArray>(obj))
        {
            UnsafeVarTo<JavascriptArray>(obj)->ClearSegmentMap();
            #ifdef VALIDATE_ARRAY
            UnsafeVarTo<JavascriptArray>(obj)->ValidateArray();
            #endif
        }

        return obj;
    }